

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O2

int Kit_GraphLeafDepth_rec(Kit_Graph_t *pGraph,Kit_Node_t *pNode,Kit_Node_t *pLeaf)

{
  int iVar1;
  int iVar2;
  Kit_Node_t *pKVar3;
  
  if (pNode != pLeaf) {
    if ((int)(((long)pNode - (long)pGraph->pNodes) / 0x18) < pGraph->nLeaves) {
      iVar1 = -100;
    }
    else {
      pKVar3 = Kit_GraphNodeFanin0(pGraph,pNode);
      iVar1 = Kit_GraphLeafDepth_rec(pGraph,pKVar3,pLeaf);
      pKVar3 = Kit_GraphNodeFanin1(pGraph,pNode);
      iVar2 = Kit_GraphLeafDepth_rec(pGraph,pKVar3,pLeaf);
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      iVar1 = iVar2 + 1;
      if (iVar2 == -100) {
        iVar1 = -100;
      }
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int Kit_GraphLeafDepth_rec( Kit_Graph_t * pGraph, Kit_Node_t * pNode, Kit_Node_t * pLeaf )
{
    int Depth0, Depth1, Depth;
    if ( pNode == pLeaf )
        return 0;
    if ( Kit_GraphNodeIsVar(pGraph, pNode) )
        return -100;
    Depth0 = Kit_GraphLeafDepth_rec( pGraph, Kit_GraphNodeFanin0(pGraph, pNode), pLeaf );
    Depth1 = Kit_GraphLeafDepth_rec( pGraph, Kit_GraphNodeFanin1(pGraph, pNode), pLeaf );
    Depth = KIT_MAX( Depth0, Depth1 );
    Depth = (Depth == -100) ? -100 : Depth + 1;
    return Depth;
}